

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__process_marker(stbi__jpeg *z,int m)

{
  byte bVar1;
  byte bVar2;
  sbyte sVar3;
  stbi_uc sVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar8;
  undefined8 *puVar9;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  int sizes [16];
  int iVar7;
  
  if (m == 0xc4) {
    iVar12 = stbi__get16be(z->s);
    for (iVar12 = iVar12 + -2; 0 < iVar12; iVar12 = (iVar12 + -0x11) - uVar8) {
      bVar5 = stbi__get8(z->s);
      if ((0x1f < bVar5) || (bVar1 = bVar5 & 0xf, 3 < bVar1)) {
LAB_001430c2:
        puVar9 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
        pcVar10 = "bad DHT header";
        goto LAB_001430ff;
      }
      uVar11 = 0;
      for (lVar15 = 0; uVar8 = (uint)uVar11, lVar15 != 0x10; lVar15 = lVar15 + 1) {
        bVar2 = stbi__get8(z->s);
        sizes[lVar15] = (uint)bVar2;
        uVar11 = (ulong)(uVar8 + bVar2);
      }
      if (0x100 < uVar8) goto LAB_001430c2;
      if (bVar5 < 0x10) {
        iVar7 = stbi__build_huffman(z->huff_dc + bVar1,sizes);
        lVar15 = 8;
      }
      else {
        iVar7 = stbi__build_huffman(z->huff_ac + bVar1,sizes);
        lVar15 = 0x1a48;
      }
      if (iVar7 == 0) goto LAB_00143106;
      for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
        sVar4 = stbi__get8(z->s);
        z->huff_dc[bVar1].values[uVar16 + lVar15 + -8] = sVar4;
      }
      if (0xf < bVar5) {
        for (lVar15 = 0; lVar15 != 0x200; lVar15 = lVar15 + 1) {
          uVar11 = (ulong)z->huff_ac[bVar1].fast[lVar15];
          z->fast_ac[bVar1][lVar15] = 0;
          if (uVar11 != 0xff) {
            bVar5 = z->huff_ac[bVar1].values[uVar11];
            if ((bVar5 & 0xf) != 0) {
              bVar2 = z->huff_ac[bVar1].size[uVar11];
              uVar6 = (bVar5 & 0xf) + (ushort)bVar2;
              if (uVar6 < 10) {
                uVar14 = (int)lVar15 << (bVar2 & 0x1f) & 0x1ff;
                sVar3 = (sbyte)(bVar5 & 0xf);
                uVar13 = -1 << sVar3 | 1;
                if (0xff < uVar14) {
                  uVar13 = 0;
                }
                iVar7 = uVar13 + (uVar14 >> (9U - sVar3 & 0x1f));
                if ((char)iVar7 == iVar7) {
                  z->fast_ac[bVar1][lVar15] = (short)iVar7 * 0x100 | bVar5 & 0xfff0 | uVar6;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    if (m != 0xdb) {
      if (m == 0xdd) {
        iVar12 = stbi__get16be(z->s);
        if (iVar12 == 4) {
          iVar12 = stbi__get16be(z->s);
          z->restart_interval = iVar12;
LAB_00143203:
          bVar17 = true;
          goto LAB_00143108;
        }
        puVar9 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
        pcVar10 = "bad DRI len";
LAB_001430ff:
        *puVar9 = pcVar10;
      }
      else {
        if (m == 0xff) {
          puVar9 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
          pcVar10 = "expected marker";
          goto LAB_001430ff;
        }
        if (m != 0xfe && (m & 0xfffffff0U) != 0xe0) {
          puVar9 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
          pcVar10 = "unknown marker";
          goto LAB_001430ff;
        }
        uVar8 = stbi__get16be(z->s);
        if (1 < uVar8) {
          if (uVar8 < 7 || m != 0xe0) {
            if (uVar8 < 0xe || m != 0xee) {
              iVar12 = uVar8 - 2;
            }
            else {
              bVar17 = true;
              for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
                sVar4 = stbi__get8(z->s);
                if (sVar4 != "Adobe"[lVar15]) {
                  bVar17 = false;
                }
              }
              if (bVar17) {
                stbi__get8(z->s);
                stbi__get16be(z->s);
                stbi__get16be(z->s);
                bVar5 = stbi__get8(z->s);
                z->app14_color_transform = (uint)bVar5;
                iVar12 = uVar8 - 0xe;
              }
              else {
                iVar12 = uVar8 - 8;
              }
            }
          }
          else {
            bVar17 = true;
            for (lVar15 = 0; lVar15 != 5; lVar15 = lVar15 + 1) {
              sVar4 = stbi__get8(z->s);
              if (sVar4 != "JFIF"[lVar15]) {
                bVar17 = false;
              }
            }
            iVar12 = uVar8 - 7;
            if (bVar17) {
              z->jfif = 1;
            }
          }
          stbi__skip(z->s,iVar12);
          goto LAB_00143203;
        }
        puVar9 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
        if (m == 0xfe) {
          pcVar10 = "bad COM len";
        }
        else {
          pcVar10 = "bad APP len";
        }
        *puVar9 = pcVar10;
      }
LAB_00143106:
      bVar17 = false;
      goto LAB_00143108;
    }
    iVar12 = stbi__get16be(z->s);
    for (iVar12 = iVar12 + -2; 0 < iVar12; iVar12 = iVar12 + (uint)(bVar5 < 0x10) * 0x40 + -0x81) {
      bVar5 = stbi__get8(z->s);
      if ((bVar5 & 0xfffffff0) != 0x10 && 0xf < bVar5) {
        puVar9 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
        pcVar10 = "bad DQT type";
        goto LAB_001430ff;
      }
      uVar8 = bVar5 & 0xf;
      if (3 < uVar8) {
        puVar9 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
        pcVar10 = "bad DQT table";
        goto LAB_001430ff;
      }
      for (lVar15 = 0; lVar15 != 0x40; lVar15 = lVar15 + 1) {
        if (bVar5 < 0x10) {
          bVar1 = stbi__get8(z->s);
          uVar6 = (ushort)bVar1;
        }
        else {
          iVar7 = stbi__get16be(z->s);
          uVar6 = (ushort)iVar7;
        }
        *(ushort *)((long)z->dequant[0] + (ulong)""[lVar15] * 2 + (ulong)(uVar8 << 7)) = uVar6;
      }
    }
  }
  bVar17 = iVar12 == 0;
LAB_00143108:
  return (int)bVar17;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            if(n > 256) return stbi__err("bad DHT header","Corrupt JPEG"); // Loop over i < n would write past end of values!
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}